

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint voc_size;
  uint size;
  uint *input;
  long lVar1;
  uchar *output;
  uint *voc;
  uint *output_00;
  ulong uVar2;
  etdc_table *table;
  etdc_table *local_38;
  
  local_38 = (etdc_table *)0x0;
  input = (uint *)malloc(40000000);
  for (lVar1 = 0; lVar1 != 10000000; lVar1 = lVar1 + 1) {
    input[lVar1] = (uint)lVar1;
  }
  output = (uchar *)malloc(40000000);
  voc_size = firstpass(&local_38,input,10000000);
  printf("Table: ");
  etdc_print(local_38);
  size = etdc_encode(&local_38,input,10000000,output);
  voc = (uint *)malloc((ulong)voc_size * 4);
  etdc_voc2uint(local_38,voc);
  for (uVar2 = 0; voc_size != uVar2; uVar2 = uVar2 + 1) {
    printf("voc[%u] = %u\n",uVar2 & 0xffffffff,(ulong)voc[uVar2]);
  }
  etdc_free(&local_38);
  output_00 = (uint *)malloc(40000000);
  etdc_decode(voc,voc_size,output,size,output_00,10000000);
  for (lVar1 = 0; lVar1 != 10000000; lVar1 = lVar1 + 1) {
    if (input[lVar1] != output_00[lVar1]) {
      printf("waaa %u %u\n");
    }
  }
  free(output);
  puts("END");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  struct etdc_table *table = NULL;
  unsigned char *output;
  unsigned int voc_size;
  int newsize;
  unsigned int *voctable;

  unsigned int *items;
  unsigned int size;
  unsigned int i;

  unsigned int *decoded;

  size = 10000000;
  items = (unsigned int *)malloc(sizeof(unsigned int)*size);
  for(i=0; i < size; i++) items[i]=i;

  
  output = (unsigned char*)malloc(sizeof(unsigned int)*size);
  voc_size = firstpass(&table, items, size);
  printf("Table: "); etdc_print(table);


  newsize = etdc_encode(&table, items, size, output);

  voctable = (unsigned int*) malloc(sizeof(unsigned int)*voc_size);
  etdc_voc2uint(table,voctable);
  for (i=0; i<voc_size;i++) printf("voc[%u] = %u\n", i, voctable[i]);
  
  etdc_free(&table);

  decoded = (unsigned int*)malloc(sizeof(unsigned int)*size);
  etdc_decode(voctable, voc_size, output, newsize, decoded, size);

  for(i=0; i<size; i++) {
    if(items[i] != decoded[i]) {
      printf("waaa %u %u\n", items[i], decoded[i]);
    }

  }

  free(output);

  printf("END\n");
  return 0;
}